

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O2

deBool deProcess_closeStdIn(deProcess *process)

{
  deFile *file;
  
  file = process->standardIn;
  if (file != (deFile *)0x0) {
    deFile_destroy(file);
    process->standardIn = (deFile *)0x0;
  }
  return (uint)(file != (deFile *)0x0);
}

Assistant:

deBool deProcess_closeStdIn (deProcess* process)
{
	if (process->standardIn)
	{
		deFile_destroy(process->standardIn);
		process->standardIn	= DE_NULL;
		return DE_TRUE;
	}
	else
		return DE_FALSE;
}